

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::parseError(QXmlStreamReaderPrivate *this)

{
  int state;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int s;
  ulong uVar7;
  QArrayDataPointer<char16_t> *this_00;
  int tk;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1String local_d0;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->token == 0) {
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    raiseError(this,PrematureEndOfDocumentError,(QString *)&local_68);
    goto LAB_00353c1d;
  }
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  state = this->state_stack[this->tos];
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  if (this->token == 0x2b) {
LAB_003539ce:
    QXmlStream::tr((QString *)&local_a8,"Unexpected \'%1\'.",(char *)0x0,-1);
    QLatin1String::QLatin1String((QLatin1String *)&local_c0,QXmlStreamGrammar::spell[this->token]);
    QString::arg<QLatin1String,_true>
              ((QString *)&local_88,(QString *)&local_a8,(QLatin1String *)&local_c0,0,(QChar)0x20);
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = local_88.d;
    local_68.ptr = local_88.ptr;
    local_88.d = pDVar1;
    local_88.ptr = pcVar2;
    local_68.size = local_88.size;
    local_88.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    this_00 = &local_a8;
  }
  else {
    iVar6 = 0;
    for (lVar8 = 0; lVar8 != 0x39; lVar8 = lVar8 + 1) {
      iVar4 = QXmlStreamGrammar::t_action(state,(int)lVar8);
      if ((0 < iVar4) && (iVar6 < 4 && QXmlStreamGrammar::spell[lVar8] != (char *)0x0)) {
        lVar5 = (long)iVar6;
        iVar6 = iVar6 + 1;
        *(int *)((long)&local_48 + lVar5 * 4) = (int)lVar8;
      }
    }
    if (3 < iVar6 || iVar6 == 0) goto LAB_003539ce;
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QXmlStream::tr((QString *)&local_a8,"\'%1\'","expected",-1);
    QLatin1String::QLatin1String((QLatin1String *)&local_c0,QXmlStreamGrammar::spell[(int)local_48])
    ;
    QString::arg<QLatin1String,_true>
              ((QString *)&local_88,(QString *)&local_a8,(QLatin1String *)&local_c0,0,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    if (iVar6 == 2) {
      QXmlStream::tr((QString *)&local_c0,"%1 or \'%2\'","expected",-1);
      QLatin1String::QLatin1String(&local_d0,QXmlStreamGrammar::spell[local_48._4_4_]);
      QString::arg<QString&,QLatin1String>
                ((type *)&local_a8,(QString *)&local_c0,(QString *)&local_88,&local_d0);
LAB_00353b4a:
      qVar3 = local_88.size;
      pcVar2 = local_88.ptr;
      pDVar1 = local_88.d;
      local_88.d = local_a8.d;
      local_88.ptr = local_a8.ptr;
      local_a8.d = pDVar1;
      local_a8.ptr = pcVar2;
      local_88.size = local_a8.size;
      local_a8.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    }
    else if (2 < iVar6) {
      for (uVar7 = 1; iVar6 - 1 != uVar7; uVar7 = uVar7 + 1) {
        QXmlStream::tr((QString *)&local_c0,"%1, \'%2\'","expected",-1);
        QLatin1String::QLatin1String
                  (&local_d0,QXmlStreamGrammar::spell[*(int *)((long)&local_48 + uVar7 * 4)]);
        QString::arg<QString&,QLatin1String>
                  ((type *)&local_a8,(QString *)&local_c0,(QString *)&local_88,&local_d0);
        qVar3 = local_88.size;
        pcVar2 = local_88.ptr;
        pDVar1 = local_88.d;
        local_88.d = local_a8.d;
        local_88.ptr = local_a8.ptr;
        local_a8.d = pDVar1;
        local_a8.ptr = pcVar2;
        local_88.size = local_a8.size;
        local_a8.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      }
      QXmlStream::tr((QString *)&local_c0,"%1, or \'%2\'","expected",-1);
      QLatin1String::QLatin1String
                (&local_d0,
                 QXmlStreamGrammar::spell[*(int *)((long)&local_48 + (ulong)(iVar6 - 1) * 4)]);
      QString::arg<QString&,QLatin1String>
                ((type *)&local_a8,(QString *)&local_c0,(QString *)&local_88,&local_d0);
      goto LAB_00353b4a;
    }
    QXmlStream::tr((QString *)&local_c0,"Expected %1, but got \'%2\'.",(char *)0x0,-1);
    QLatin1String::QLatin1String(&local_d0,QXmlStreamGrammar::spell[this->token]);
    QString::arg<QString&,QLatin1String>
              ((type *)&local_a8,(QString *)&local_c0,(QString *)&local_88,&local_d0);
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = local_a8.d;
    local_68.ptr = local_a8.ptr;
    local_a8.d = pDVar1;
    local_a8.ptr = pcVar2;
    local_68.size = local_a8.size;
    local_a8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    this_00 = &local_88;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  raiseWellFormedError(this,(QString *)&local_68);
LAB_00353c1d:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::parseError()
{

    if (token == EOF_SYMBOL) {
        raiseError(QXmlStreamReader::PrematureEndOfDocumentError);
        return;
    }
    const int nmax = 4;
    QString error_message;
    int ers = state_stack[tos];
    int nexpected = 0;
    int expected[nmax];
    if (token != XML_ERROR)
        for (int tk = 0; tk < TERMINAL_COUNT; ++tk) {
            int k = t_action(ers, tk);
            if (k <= 0)
                continue;
            if (spell[tk]) {
                if (nexpected < nmax)
                    expected[nexpected++] = tk;
            }
        }

    if (nexpected && nexpected < nmax) {
        //: '<first option>'
        QString exp_str = QXmlStream::tr("'%1'", "expected")
                .arg(QLatin1StringView(spell[expected[0]]));
        if (nexpected == 2) {
            //: <first option>, '<second option>'
            exp_str = QXmlStream::tr("%1 or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[1]]));
        } else if (nexpected > 2) {
            int s = 1;
            for (; s < nexpected - 1; ++s) {
                //: <options so far>, '<next option>'
                exp_str = QXmlStream::tr("%1, '%2'", "expected")
                        .arg(exp_str, QLatin1StringView(spell[expected[s]]));
            }
            //: <options so far>, or '<final option>'
            exp_str = QXmlStream::tr("%1, or '%2'", "expected")
                    .arg(exp_str, QLatin1StringView(spell[expected[s]]));
        }
        error_message = QXmlStream::tr("Expected %1, but got '%2'.")
                .arg(exp_str, QLatin1StringView(spell[token]));
    } else {
        error_message = QXmlStream::tr("Unexpected '%1'.").arg(QLatin1StringView(spell[token]));
    }

    raiseWellFormedError(error_message);
}